

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memtok.c
# Opt level: O1

ssize_t mpt_memtok(iovec *data,size_t ndat,char *tok,char *com,char *escape)

{
  byte *pbVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  size_t *psVar5;
  void *pvVar6;
  ushort **ppuVar7;
  ulong uVar8;
  int *piVar9;
  size_t *psVar10;
  ulong uVar11;
  int iVar12;
  byte *pbVar13;
  byte *pbVar14;
  ssize_t sVar15;
  ulong uVar16;
  ulong uVar17;
  size_t sVar18;
  uint local_78;
  uint local_74;
  size_t local_70;
  size_t local_68;
  size_t local_58;
  
  sVar15 = -1;
  if (data != (iovec *)0x0) {
    if (tok == (char *)0x0) {
      local_70 = 0;
    }
    else {
      local_70 = strlen(tok);
    }
    if (com == (char *)0x0) {
      local_58 = 0;
    }
    else {
      local_58 = strlen(com);
    }
    if (escape == (char *)0x0) {
      local_68 = 0;
    }
    else {
      local_68 = strlen(escape);
    }
    psVar10 = &data->iov_len;
    local_74 = 0x20;
    uVar11 = 0;
    sVar18 = 0;
    uVar16 = 0;
    pbVar14 = (byte *)0x0;
    local_78 = 0;
    do {
      uVar16 = uVar16 + 1;
      if (sVar18 <= uVar16) {
        iVar12 = 0xb;
        if (ndat <= uVar11) {
LAB_00114e38:
          sVar15 = -2;
          goto LAB_00114e58;
        }
        psVar5 = psVar10 + uVar11 * 2;
        while (sVar18 = *psVar5, sVar18 == 0) {
          uVar11 = uVar11 + 1;
          psVar5 = psVar5 + 2;
          if (ndat <= uVar11) goto LAB_00114e38;
        }
        pbVar14 = (byte *)((iovec *)(psVar5 + -1))->iov_base;
        uVar11 = uVar11 + 1;
        uVar16 = 0;
      }
      if (local_68 == 0) {
LAB_00114d25:
        if (((local_58 != 0) &&
            (pvVar6 = memchr(com,(uint)*pbVar14,local_58), pvVar6 != (void *)0x0)) &&
           (ppuVar7 = __ctype_b_loc(),
           (*(byte *)((long)*ppuVar7 + (ulong)local_74 * 2 + 1) & 0x20) != 0)) {
          if (tok == (char *)0x0) {
            do {
              uVar8 = uVar16;
              if (uVar16 < sVar18) {
                uVar8 = sVar18;
              }
              pbVar13 = pbVar14;
              uVar17 = uVar16;
              do {
                pbVar14 = pbVar13;
                uVar16 = uVar8 + 1;
                if (sVar18 <= uVar17) break;
                uVar16 = uVar17 + 1;
                pbVar14 = pbVar13 + 1;
                pbVar1 = pbVar13 + 1;
                pbVar13 = pbVar14;
                uVar17 = uVar16;
              } while (*pbVar1 != 10);
              if (uVar16 <= sVar18) goto LAB_00114dc8;
              if (ndat <= uVar11) goto LAB_00114e4c;
              pbVar14 = (byte *)data[uVar11].iov_base;
              sVar18 = data[uVar11].iov_len;
              uVar11 = uVar11 + 1;
              uVar16 = 0;
            } while( true );
          }
          goto LAB_00114e41;
        }
LAB_00114dc8:
        if (tok == (char *)0x0) {
          ppuVar7 = __ctype_b_loc();
          if ((*(byte *)((long)*ppuVar7 + (ulong)*pbVar14 * 2 + 1) & 0x20) == 0) goto LAB_00114e41;
        }
        else if ((local_70 != 0) &&
                (pvVar6 = memchr(tok,(uint)*pbVar14,local_70), pvVar6 != (void *)0x0))
        goto LAB_00114e41;
        local_74 = (uint)*pbVar14;
        uVar3 = local_78;
      }
      else {
        bVar2 = *pbVar14;
        if (local_78 == 0) {
          pvVar6 = memchr(escape,(uint)bVar2,local_68);
          uVar3 = (uint)bVar2;
          if (pvVar6 == (void *)0x0) goto LAB_00114d25;
        }
        else {
          uVar4 = local_78;
          if (local_74 != 0x5c) {
            uVar4 = 0;
          }
          local_74 = (uint)bVar2;
          uVar3 = local_78;
          if (local_78 == local_74) {
            uVar3 = uVar4;
          }
        }
      }
      local_78 = uVar3;
      pbVar14 = pbVar14 + 1;
    } while( true );
  }
  iVar12 = 0xe;
LAB_00114e58:
  piVar9 = __errno_location();
  *piVar9 = iVar12;
  return sVar15;
LAB_00114e41:
  if (local_78 == 0) {
    while( true ) {
      uVar11 = uVar11 - 1;
      if (uVar11 == 0) {
        return uVar16;
      }
      uVar16 = uVar16 + *psVar10;
      if ((long)uVar16 < 0) break;
      psVar10 = psVar10 + 2;
    }
    iVar12 = 0x4b;
    sVar15 = -1;
  }
  else {
LAB_00114e4c:
    sVar15 = -2;
    iVar12 = 0xb;
  }
  goto LAB_00114e58;
}

Assistant:

extern ssize_t mpt_memtok(const struct iovec *data, size_t ndat, const char *tok, const char *com, const char *escape)
{
	unsigned char	*curr = NULL;
	size_t	i = 0, len = 0, pos = 0, tlen, clen, elen;
	int	match = 0, prev = ' ';
	
	if ( data == NULL ) {
		errno = EFAULT; return -1;
	}
	
	tlen = tok ? strlen(tok) : 0;
	clen = com ? strlen(com) : 0;
	elen = escape ? strlen(escape) : 0;
	
	while ( 1 ) {
		/* continue in next data part */
		if ( ++pos >= len ) {
			if ( i >= ndat ) {
				errno = EAGAIN; return -2;
			}
			pos  = 0;
			curr = data[i].iov_base;
			if ( !(len = data[i++].iov_len ) )
				continue;
		}
		/* check for escape character */
		if ( elen ) {
			if ( match ) {
				/* unset if current is valid end */
				if ( *curr == match && prev != '\\' )
					match = 0;
				prev = *(curr++);
				continue;
			}
			/* mark if current is in delimiters */
			else if ( memchr(escape, *curr, elen) ) {
				match = *(curr++);
				continue;
			}
		}
		/* charater is in comments */
		if ( clen && memchr(com, *curr, clen) && isspace(prev) ) {
			if ( tok )
				break;
			/* continue until end of line */
			do {
				while ( pos++ < len && *(++curr) != '\n' );
				
				if ( pos <= len )
					break;
				else if ( i >= ndat ) {
					errno = EAGAIN; return -2;
				}
				pos  = 0;
				curr = data[i].iov_base;
				len  = data[i++].iov_len;
				
			} while ( 1 );
		}
		/* token is found */
		if ( tok ) {
			if ( tlen && memchr(tok, *curr, tlen) )
				break;
		}
		/* finding visible character succeeded */
		else if ( !isspace(*curr) )
			break;
		
		prev = *(curr++);
	}
	
	i--;
	
	/* escaped sequence unfinished */
	if ( match ) {
		errno = EAGAIN; return -2;
	}
	for ( elen = 0 ; elen < i ; elen ++ ) {
		/* offset is to big for return value */
		if ( (pos += data[elen].iov_len) > SSIZE_MAX ) {
			errno = EOVERFLOW; return -1;
		}
	}
	
	return pos;
}